

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_ntlm_core_mk_lm_hash(char *password,uchar *lmbuffer)

{
  size_t sVar1;
  anon_union_8_2_85ee1207 local_b8;
  undefined1 local_b0 [8];
  DES_key_schedule ks;
  size_t len;
  uchar uStack_1f;
  uchar pw [14];
  uchar *lmbuffer_local;
  char *password_local;
  
  pw._6_8_ = lmbuffer;
  sVar1 = strlen(password);
  if (sVar1 < 0xe) {
    local_b8 = (anon_union_8_2_85ee1207)strlen(password);
  }
  else {
    local_b8 = (anon_union_8_2_85ee1207)0xe;
  }
  ks.ks[0xf] = local_b8;
  Curl_strntoupper((char *)((long)&len + 2),password,(size_t)local_b8);
  memset((void *)((long)&len + (long)ks.ks[0xf] + 2),0,0xe - (long)ks.ks[0xf]);
  setup_des_key((uchar *)((long)&len + 2),(DES_key_schedule *)local_b0);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",(DES_cblock *)pw._6_8_,(DES_key_schedule *)local_b0
                  ,1);
  setup_des_key(&uStack_1f,(DES_key_schedule *)local_b0);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",(DES_cblock *)(pw._6_8_ + 8),
                  (DES_key_schedule *)local_b0,1);
  memset((void *)(pw._6_8_ + 0x10),0,5);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ntlm_core_mk_lm_hash(const char *password,
                                   unsigned char *lmbuffer /* 21 bytes */)
{
  unsigned char pw[14];
#if !defined(CURL_NTLM_NOT_SUPPORTED)
  static const unsigned char magic[] = {
    0x4B, 0x47, 0x53, 0x21, 0x40, 0x23, 0x24, 0x25 /* i.e. KGS!@#$% */
  };
#endif
  size_t len = CURLMIN(strlen(password), 14);

  Curl_strntoupper((char *)pw, password, len);
  memset(&pw[len], 0, 14 - len);

  {
    /* Create LanManager hashed password. */

#if defined(USE_OPENSSL_DES) || defined(USE_WOLFSSL)
    DES_key_schedule ks;

    setup_des_key(pw, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)lmbuffer,
                    DESKEY(ks), DES_ENCRYPT);

    setup_des_key(pw + 7, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)(lmbuffer + 8),
                    DESKEY(ks), DES_ENCRYPT);
#elif defined(USE_GNUTLS)
    struct des_ctx des;
    setup_des_key(pw, &des);
    des_encrypt(&des, 8, lmbuffer, magic);
    setup_des_key(pw + 7, &des);
    des_encrypt(&des, 8, lmbuffer + 8, magic);
#elif defined(USE_MBEDTLS) || defined(USE_SECTRANSP)            \
  || defined(USE_OS400CRYPTO) || defined(USE_WIN32_CRYPTO)
    encrypt_des(magic, lmbuffer, pw);
    encrypt_des(magic, lmbuffer + 8, pw + 7);
#endif

    memset(lmbuffer + 16, 0, 21 - 16);
  }

  return CURLE_OK;
}